

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O2

MPP_RET check_buf_need_sync(MppBuffer buffer,MPP_RET *ret,char *caller)

{
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","check buffer found NULL pointer from %s\n",(char *)0x0,caller);
  }
  else if (*(int *)((long)buffer + 0xa0) < 1) {
    _mpp_log_l(2,"mpp_buffer","check fd found invalid fd %d from %s\n",(char *)0x0);
  }
  else {
    if (*(int *)((long)buffer + 0xb8) == 0) {
      return MPP_OK;
    }
    *ret = MPP_OK;
  }
  return MPP_NOK;
}

Assistant:

static MPP_RET check_buf_need_sync(MppBuffer buffer, MPP_RET *ret, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("check buffer found NULL pointer from %s\n", caller);
        return MPP_NOK;
    }

    MppBufferImpl *impl = (MppBufferImpl *)buffer;

    if (impl->info.fd <= 0) {
        mpp_err("check fd found invalid fd %d from %s\n", impl->info.fd, caller);
        return MPP_NOK;
    }

    /* uncached buffer do not need to sync */
    if (impl->uncached) {
        *ret = MPP_OK;
        return MPP_NOK;
    }

    return MPP_OK;
}